

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MES.h
# Opt level: O0

int GetLatestDataMES(MES *pMES,double *pDistance)

{
  int iVar1;
  double dVar2;
  undefined1 local_d8 [8];
  CHRONO chrono;
  char *ptr;
  int local_80;
  int recvbuflen;
  int Bytes;
  int BytesReceived;
  char savebuf [24];
  uint8 local_58 [8];
  char recvbuf [48];
  double *pDistance_local;
  MES *pMES_local;
  
  recvbuflen = 0;
  local_80 = 0;
  chrono.Suspended = 0;
  chrono._68_4_ = 0;
  StartChrono((CHRONO *)local_d8);
  memset(local_58,0,0x30);
  memset(&Bytes,0,0x18);
  recvbuflen = 0;
  iVar1 = ReadRS232Port(&pMES->RS232Port,local_58,0x17,&local_80);
  if (iVar1 == 0) {
    if ((pMES->bSaveRawData != 0) && (pMES->pfSaveFile != (FILE *)0x0)) {
      fwrite(local_58,(long)local_80,1,(FILE *)pMES->pfSaveFile);
      fflush((FILE *)pMES->pfSaveFile);
    }
    recvbuflen = local_80 + recvbuflen;
    if (0x16 < recvbuflen) {
      while (local_80 == 0x17) {
        dVar2 = GetTimeElapsedChronoQuick((CHRONO *)local_d8);
        if (4.0 < dVar2) {
          printf("Error reading data from a MES : Message timeout. \n");
          return 2;
        }
        memcpy(&Bytes,local_58,(long)local_80);
        iVar1 = ReadRS232Port(&pMES->RS232Port,local_58,0x17,&local_80);
        if (iVar1 != 0) {
          printf("Error reading data from a MES. \n");
          return 1;
        }
        if ((pMES->bSaveRawData != 0) && (pMES->pfSaveFile != (FILE *)0x0)) {
          fwrite(local_58,(long)local_80,1,(FILE *)pMES->pfSaveFile);
          fflush((FILE *)pMES->pfSaveFile);
        }
        recvbuflen = local_80 + recvbuflen;
      }
      memmove(recvbuf + (0xf - (long)local_80),local_58,(long)local_80);
      memcpy(local_58,(void *)((long)&Bytes + (long)local_80),(long)(0x17 - local_80));
      recvbuflen = 0x17;
    }
    chrono._64_8_ = FindLatestMESMessage((char *)local_58);
    while (chrono._64_8_ == 0) {
      dVar2 = GetTimeElapsedChronoQuick((CHRONO *)local_d8);
      if (4.0 < dVar2) {
        printf("Error reading data from a MES : Message timeout. \n");
        return 2;
      }
      if (0x2e < recvbuflen) {
        printf("Error reading data from a MES : Invalid data. \n");
        return 4;
      }
      iVar1 = ReadRS232Port(&pMES->RS232Port,local_58 + recvbuflen,0x2f - recvbuflen,&local_80);
      if (iVar1 != 0) {
        printf("Error reading data from a MES. \n");
        return 1;
      }
      if ((pMES->bSaveRawData != 0) && (pMES->pfSaveFile != (FILE *)0x0)) {
        fwrite(local_58 + recvbuflen,(long)local_80,1,(FILE *)pMES->pfSaveFile);
        fflush((FILE *)pMES->pfSaveFile);
      }
      recvbuflen = local_80 + recvbuflen;
      chrono._64_8_ = FindLatestMESMessage((char *)local_58);
    }
    iVar1 = __isoc99_sscanf(chrono._64_8_,"%lfm\r\n",pDistance);
    if (iVar1 == 1) {
      pMES->LastDistance = *pDistance;
      pMES_local._4_4_ = 0;
    }
    else {
      printf("Error reading data from a MES : Invalid data. \n");
      pMES_local._4_4_ = 1;
    }
  }
  else {
    printf("Error reading data from a MES. \n");
    pMES_local._4_4_ = 1;
  }
  return pMES_local._4_4_;
}

Assistant:

inline int GetLatestDataMES(MES* pMES, double* pDistance)
{
	char recvbuf[2*MAX_NB_BYTES_MES];
	char savebuf[MAX_NB_BYTES_MES];
	int BytesReceived = 0, Bytes = 0, recvbuflen = 0;
	char* ptr = NULL;
	CHRONO chrono;

	StartChrono(&chrono);

	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	memset(savebuf, 0, sizeof(savebuf));
	recvbuflen = MAX_NB_BYTES_MES-1; // The last character must be a 0 to be a valid string for sscanf.
	BytesReceived = 0;

	if (ReadRS232Port(&pMES->RS232Port, (unsigned char*)recvbuf, recvbuflen, &Bytes) != EXIT_SUCCESS)
	{
		printf("Error reading data from a MES. \n");
		return EXIT_FAILURE;
	}
	if ((pMES->bSaveRawData)&&(pMES->pfSaveFile))
	{
		fwrite(recvbuf, Bytes, 1, pMES->pfSaveFile);
		fflush(pMES->pfSaveFile);
	}
	BytesReceived += Bytes;

	if (BytesReceived >= recvbuflen)
	{
		// If the buffer is full and if the device always sends data, there might be old data to discard...

		while (Bytes == recvbuflen)
		{
			if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_MES)
			{
				printf("Error reading data from a MES : Message timeout. \n");
				return EXIT_TIMEOUT;
			}
			memcpy(savebuf, recvbuf, Bytes);
			if (ReadRS232Port(&pMES->RS232Port, (unsigned char*)recvbuf, recvbuflen, &Bytes) != EXIT_SUCCESS)
			{
				printf("Error reading data from a MES. \n");
				return EXIT_FAILURE;
			}
			if ((pMES->bSaveRawData)&&(pMES->pfSaveFile)) 
			{
				fwrite(recvbuf, Bytes, 1, pMES->pfSaveFile);
				fflush(pMES->pfSaveFile);
			}
			BytesReceived += Bytes;
		}

		// The desired message should be among all the data gathered, unless there was 
		// so many other messages sent after that the desired message was in the 
		// discarded data, or we did not wait enough...

		memmove(recvbuf+recvbuflen-Bytes, recvbuf, Bytes);
		memcpy(recvbuf, savebuf+Bytes, recvbuflen-Bytes);

		// Only the last recvbuflen bytes received should be taken into account in what follows.
		BytesReceived = recvbuflen;
	}

	// The data need to be analyzed and we must check if we need to get more data from 
	// the device to get the desired message.
	// But normally we should not have to get more data unless we did not wait enough
	// for the desired message...

	ptr = FindLatestMESMessage(recvbuf);

	while (!ptr)
	{
		if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_MES)
		{
			printf("Error reading data from a MES : Message timeout. \n");
			return EXIT_TIMEOUT;
		}
		// The last character must be a 0 to be a valid string for sscanf.
		if (BytesReceived >= 2*MAX_NB_BYTES_MES-1)
		{
			printf("Error reading data from a MES : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}
		if (ReadRS232Port(&pMES->RS232Port, (unsigned char*)recvbuf+BytesReceived, 2*MAX_NB_BYTES_MES-1-BytesReceived, &Bytes) != EXIT_SUCCESS)
		{
			printf("Error reading data from a MES. \n");
			return EXIT_FAILURE;
		}
		if ((pMES->bSaveRawData)&&(pMES->pfSaveFile)) 
		{
			fwrite((unsigned char*)recvbuf+BytesReceived, Bytes, 1, pMES->pfSaveFile);
			fflush(pMES->pfSaveFile);
		}
		BytesReceived += Bytes;
		ptr = FindLatestMESMessage(recvbuf);
	}

	// Analyze data.

	if (sscanf(ptr, "%lfm\r\n", pDistance) != 1)
	{
		printf("Error reading data from a MES : Invalid data. \n");
		return EXIT_FAILURE;
	}

	pMES->LastDistance = *pDistance;

	return EXIT_SUCCESS;
}